

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O0

CordRep * __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::NextUp(CordRepBtreeNavigator *this)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  CordRep *pCVar4;
  int local_2c;
  size_t sStack_28;
  int height;
  size_t index;
  CordRepBtree *edge;
  CordRepBtreeNavigator *this_local;
  
  bVar1 = this->index_[0];
  sVar3 = CordRepBtree::back(this->node_[0]);
  if (bVar1 != sVar3) {
    __assert_fail("index_[0] == node_[0]->back()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xe4,"CordRep *absl::cord_internal::CordRepBtreeNavigator::NextUp()");
  }
  local_2c = 0;
  do {
    local_2c = local_2c + 1;
    if (this->height_ < local_2c) {
      return (CordRep *)0x0;
    }
    index = (size_t)this->node_[local_2c];
    iVar2 = this->index_[local_2c] + 1;
    sStack_28 = (size_t)iVar2;
    sVar3 = CordRepBtree::end((CordRepBtree *)index);
  } while (sStack_28 == sVar3);
  this->index_[local_2c] = (uint8_t)iVar2;
  do {
    pCVar4 = CordRepBtree::Edge((CordRepBtree *)index,sStack_28);
    index = (size_t)CordRep::btree(pCVar4);
    local_2c = local_2c + -1;
    this->node_[local_2c] = (CordRepBtree *)index;
    sStack_28 = CordRepBtree::begin((CordRepBtree *)index);
    this->index_[local_2c] = (uint8_t)sStack_28;
  } while (0 < local_2c);
  pCVar4 = CordRepBtree::Edge((CordRepBtree *)index,sStack_28);
  return pCVar4;
}

Assistant:

inline CordRep* CordRepBtreeNavigator::NextUp() {
  assert(index_[0] == node_[0]->back());
  CordRepBtree* edge;
  size_t index;
  int height = 0;
  do {
    if (++height > height_) return nullptr;
    edge = node_[height];
    index = index_[height] + 1;
  } while (index == edge->end());
  index_[height] = static_cast<uint8_t>(index);
  do {
    node_[--height] = edge = edge->Edge(index)->btree();
    index_[height] = static_cast<uint8_t>(index = edge->begin());
  } while (height > 0);
  return edge->Edge(index);
}